

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PDFCommentWriter.cpp
# Opt level: O0

EStatusCodeAndObjectIDType __thiscall
PDFCommentWriter::WriteCommentsTree
          (PDFCommentWriter *this,PDFComment *inComment,
          PDFCommentToObjectIDTypeMap *inCommentsContext)

{
  bool bVar1;
  EStatusCode EVar2;
  pointer ppVar3;
  Trace *pTVar4;
  DictionaryContext *pDVar5;
  string *psVar6;
  EStatusCodeAndObjectIDType EVar7;
  pair<PDFComment_*const,_unsigned_long> local_370;
  allocator<char> local_359;
  string local_358;
  allocator<char> local_331;
  string local_330;
  allocator<char> local_309;
  string local_308;
  allocator<char> local_2e1;
  string local_2e0;
  allocator<char> local_2b9;
  string local_2b8;
  ObjectReference local_298;
  allocator<char> local_281;
  string local_280;
  string local_260;
  allocator<char> local_239;
  string local_238;
  PDFTextString local_218;
  allocator<char> local_1f1;
  string local_1f0;
  allocator<char> local_1c9;
  string local_1c8;
  PDFTextString local_1a8;
  allocator<char> local_181;
  string local_180;
  PDFRectangle local_160;
  allocator<char> local_139;
  string local_138;
  allocator<char> local_111;
  string local_110;
  allocator<char> local_e9;
  string local_e8;
  allocator<char> local_c1;
  string local_c0;
  allocator<char> local_89;
  string local_88;
  DictionaryContext *local_68;
  DictionaryContext *dictionaryContext;
  ObjectsContext *objectsContext;
  EStatusCodeAndObjectIDType repliedtoResult;
  _Self local_40;
  iterator it;
  ObjectIDType repliedTo;
  PDFCommentToObjectIDTypeMap *inCommentsContext_local;
  PDFComment *inComment_local;
  PDFCommentWriter *this_local;
  EStatusCodeAndObjectIDType result;
  
  inCommentsContext_local = (PDFCommentToObjectIDTypeMap *)inComment;
  inComment_local = (PDFComment *)this;
  std::pair<PDFHummus::EStatusCode,_unsigned_long>::
  pair<PDFHummus::EStatusCode,_unsigned_long,_true>
            ((pair<PDFHummus::EStatusCode,_unsigned_long> *)&this_local);
  it._M_node = (_Base_ptr)0x0;
  local_40._M_node =
       (_Base_ptr)
       std::
       map<PDFComment_*,_unsigned_long,_std::less<PDFComment_*>,_std::allocator<std::pair<PDFComment_*const,_unsigned_long>_>_>
       ::find(inCommentsContext,(key_type *)&inCommentsContext_local);
  repliedtoResult.second =
       (unsigned_long)
       std::
       map<PDFComment_*,_unsigned_long,_std::less<PDFComment_*>,_std::allocator<std::pair<PDFComment_*const,_unsigned_long>_>_>
       ::end(inCommentsContext);
  bVar1 = std::operator!=(&local_40,(_Self *)&repliedtoResult.second);
  if (bVar1) {
    this_local._0_4_ = 0;
    ppVar3 = std::_Rb_tree_iterator<std::pair<PDFComment_*const,_unsigned_long>_>::operator->
                       (&local_40);
    result._0_8_ = ppVar3->second;
  }
  else {
    if (*(long *)&inCommentsContext_local[3]._M_t._M_impl != 0) {
      EVar7 = WriteCommentsTree(this,*(PDFComment **)&inCommentsContext_local[3]._M_t._M_impl,
                                inCommentsContext);
      repliedtoResult._0_8_ = EVar7.second;
      if (EVar7.first != eSuccess) {
        this_local._0_4_ = 0xffffffff;
        result.first = eSuccess;
        result._4_4_ = 0;
        goto LAB_001bfe0d;
      }
      objectsContext._0_4_ = 0;
      it._M_node = (_Base_ptr)repliedtoResult._0_8_;
    }
    dictionaryContext = (DictionaryContext *)PDFWriter::GetObjectsContext(this->mPDFWriter);
    result._0_8_ = ObjectsContext::StartNewIndirectObject((ObjectsContext *)dictionaryContext);
    if (result._0_8_ == 0) {
      this_local._0_4_ = 0xffffffff;
      pTVar4 = Trace::DefaultTrace();
      Trace::TraceToLog(pTVar4,
                        "PDFCommentWriter::WriteCommentsTree, Exception in starting comment dictionary"
                       );
    }
    else {
      pDVar5 = ObjectsContext::StartDictionary((ObjectsContext *)dictionaryContext);
      local_68 = pDVar5;
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>((string *)&local_88,"Type",&local_89);
      DictionaryContext::WriteKey(pDVar5,&local_88);
      std::__cxx11::string::~string((string *)&local_88);
      std::allocator<char>::~allocator(&local_89);
      pDVar5 = local_68;
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>((string *)&local_c0,"Annot",&local_c1);
      DictionaryContext::WriteNameValue(pDVar5,&local_c0);
      std::__cxx11::string::~string((string *)&local_c0);
      std::allocator<char>::~allocator(&local_c1);
      pDVar5 = local_68;
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>((string *)&local_e8,"Subtype",&local_e9);
      DictionaryContext::WriteKey(pDVar5,&local_e8);
      std::__cxx11::string::~string((string *)&local_e8);
      std::allocator<char>::~allocator(&local_e9);
      pDVar5 = local_68;
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>((string *)&local_110,"Text",&local_111);
      DictionaryContext::WriteNameValue(pDVar5,&local_110);
      std::__cxx11::string::~string((string *)&local_110);
      std::allocator<char>::~allocator(&local_111);
      pDVar5 = local_68;
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>((string *)&local_138,"Rect",&local_139);
      DictionaryContext::WriteKey(pDVar5,&local_138);
      std::__cxx11::string::~string((string *)&local_138);
      std::allocator<char>::~allocator(&local_139);
      pDVar5 = local_68;
      PDFRectangle::PDFRectangle
                (&local_160,
                 (double)inCommentsContext_local[1]._M_t._M_impl.super__Rb_tree_header._M_header.
                         _M_parent,
                 (double)inCommentsContext_local[1]._M_t._M_impl.super__Rb_tree_header._M_header.
                         _M_left,
                 (double)inCommentsContext_local[1]._M_t._M_impl.super__Rb_tree_header._M_header.
                         _M_right,
                 (double)inCommentsContext_local[1]._M_t._M_impl.super__Rb_tree_header._M_node_count
                );
      DictionaryContext::WriteRectangleValue(pDVar5,&local_160);
      PDFRectangle::~PDFRectangle(&local_160);
      pDVar5 = local_68;
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>((string *)&local_180,"Contents",&local_181)
      ;
      DictionaryContext::WriteKey(pDVar5,&local_180);
      std::__cxx11::string::~string((string *)&local_180);
      std::allocator<char>::~allocator(&local_181);
      pDVar5 = local_68;
      PDFTextString::PDFTextString(&local_1a8,(string *)inCommentsContext_local);
      psVar6 = PDFTextString::ToString_abi_cxx11_(&local_1a8);
      DictionaryContext::WriteLiteralStringValue(pDVar5,psVar6);
      PDFTextString::~PDFTextString(&local_1a8);
      pDVar5 = local_68;
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>((string *)&local_1c8,"C",&local_1c9);
      DictionaryContext::WriteKey(pDVar5,&local_1c8);
      std::__cxx11::string::~string((string *)&local_1c8);
      std::allocator<char>::~allocator(&local_1c9);
      ObjectsContext::StartArray((ObjectsContext *)dictionaryContext);
      if ((undefined1  [48])
          ((undefined1  [48])inCommentsContext_local[2]._M_t._M_impl & (undefined1  [48])0x1) ==
          (undefined1  [48])0x0) {
        ObjectsContext::WriteDouble
                  ((ObjectsContext *)dictionaryContext,
                   (double)(byte)inCommentsContext_local[2]._M_t._M_impl.field_0x1 / 255.0,
                   eTokenSeparatorSpace);
        ObjectsContext::WriteDouble
                  ((ObjectsContext *)dictionaryContext,
                   (double)(byte)inCommentsContext_local[2]._M_t._M_impl.field_0x2 / 255.0,
                   eTokenSeparatorSpace);
        ObjectsContext::WriteDouble
                  ((ObjectsContext *)dictionaryContext,
                   (double)(byte)inCommentsContext_local[2]._M_t._M_impl.field_0x3 / 255.0,
                   eTokenSeparatorSpace);
      }
      else {
        ObjectsContext::WriteDouble
                  ((ObjectsContext *)dictionaryContext,
                   (double)(byte)inCommentsContext_local[2]._M_t._M_impl.field_0x4 / 255.0,
                   eTokenSeparatorSpace);
        ObjectsContext::WriteDouble
                  ((ObjectsContext *)dictionaryContext,
                   (double)(byte)inCommentsContext_local[2]._M_t._M_impl.field_0x5 / 255.0,
                   eTokenSeparatorSpace);
        ObjectsContext::WriteDouble
                  ((ObjectsContext *)dictionaryContext,
                   (double)(byte)inCommentsContext_local[2]._M_t._M_impl.field_0x6 / 255.0,
                   eTokenSeparatorSpace);
        ObjectsContext::WriteDouble
                  ((ObjectsContext *)dictionaryContext,
                   (double)(byte)inCommentsContext_local[2]._M_t._M_impl.field_0x7 / 255.0,
                   eTokenSeparatorSpace);
      }
      ObjectsContext::EndArray((ObjectsContext *)dictionaryContext,eTokenSeparatorEndLine);
      pDVar5 = local_68;
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>((string *)&local_1f0,"T",&local_1f1);
      DictionaryContext::WriteKey(pDVar5,&local_1f0);
      std::__cxx11::string::~string((string *)&local_1f0);
      std::allocator<char>::~allocator(&local_1f1);
      pDVar5 = local_68;
      PDFTextString::PDFTextString
                (&local_218,
                 (string *)
                 &(inCommentsContext_local->_M_t)._M_impl.super__Rb_tree_header._M_header._M_right);
      psVar6 = PDFTextString::ToString_abi_cxx11_(&local_218);
      DictionaryContext::WriteLiteralStringValue(pDVar5,psVar6);
      PDFTextString::~PDFTextString(&local_218);
      pDVar5 = local_68;
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>((string *)&local_238,"M",&local_239);
      DictionaryContext::WriteKey(pDVar5,&local_238);
      std::__cxx11::string::~string((string *)&local_238);
      std::allocator<char>::~allocator(&local_239);
      pDVar5 = local_68;
      PDFDate::ToString_abi_cxx11_
                (&local_260,
                 (PDFDate *)&inCommentsContext_local[2]._M_t._M_impl.super__Rb_tree_header);
      DictionaryContext::WriteLiteralStringValue(pDVar5,&local_260);
      std::__cxx11::string::~string((string *)&local_260);
      pDVar5 = local_68;
      if (*(long *)&inCommentsContext_local[3]._M_t._M_impl != 0) {
        std::allocator<char>::allocator();
        std::__cxx11::string::string<std::allocator<char>>((string *)&local_280,"IRT",&local_281);
        DictionaryContext::WriteKey(pDVar5,&local_280);
        std::__cxx11::string::~string((string *)&local_280);
        std::allocator<char>::~allocator(&local_281);
        pDVar5 = local_68;
        ObjectReference::ObjectReference(&local_298,(ObjectIDType)it._M_node);
        DictionaryContext::WriteObjectReferenceValue(pDVar5,&local_298);
        pDVar5 = local_68;
        std::allocator<char>::allocator();
        std::__cxx11::string::string<std::allocator<char>>((string *)&local_2b8,"RT",&local_2b9);
        DictionaryContext::WriteKey(pDVar5,&local_2b8);
        std::__cxx11::string::~string((string *)&local_2b8);
        std::allocator<char>::~allocator(&local_2b9);
        pDVar5 = local_68;
        std::allocator<char>::allocator();
        std::__cxx11::string::string<std::allocator<char>>((string *)&local_2e0,"R",&local_2e1);
        DictionaryContext::WriteNameValue(pDVar5,&local_2e0);
        std::__cxx11::string::~string((string *)&local_2e0);
        std::allocator<char>::~allocator(&local_2e1);
      }
      pDVar5 = local_68;
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>((string *)&local_308,"Open",&local_309);
      DictionaryContext::WriteKey(pDVar5,&local_308);
      std::__cxx11::string::~string((string *)&local_308);
      std::allocator<char>::~allocator(&local_309);
      DictionaryContext::WriteBooleanValue(local_68,false);
      pDVar5 = local_68;
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>((string *)&local_330,"Name",&local_331);
      DictionaryContext::WriteKey(pDVar5,&local_330);
      std::__cxx11::string::~string((string *)&local_330);
      std::allocator<char>::~allocator(&local_331);
      pDVar5 = local_68;
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>((string *)&local_358,"Comment",&local_359);
      DictionaryContext::WriteNameValue(pDVar5,&local_358);
      std::__cxx11::string::~string((string *)&local_358);
      std::allocator<char>::~allocator(&local_359);
      EVar2 = ObjectsContext::EndDictionary((ObjectsContext *)dictionaryContext,local_68);
      if (EVar2 == eSuccess) {
        ObjectsContext::EndIndirectObject((ObjectsContext *)dictionaryContext);
        std::pair<PDFComment_*const,_unsigned_long>::pair<PDFComment_*&,_unsigned_long_&,_true>
                  (&local_370,(PDFComment **)&inCommentsContext_local,(unsigned_long *)&result);
        std::
        map<PDFComment_*,_unsigned_long,_std::less<PDFComment_*>,_std::allocator<std::pair<PDFComment_*const,_unsigned_long>_>_>
        ::insert(inCommentsContext,&local_370);
        this_local._0_4_ = 0;
      }
      else {
        this_local._0_4_ = 0xffffffff;
        pTVar4 = Trace::DefaultTrace();
        Trace::TraceToLog(pTVar4,
                          "PDFCommentWriter::WriteCommentsTree, Exception in ending comment dictionary"
                         );
      }
    }
  }
LAB_001bfe0d:
  EVar7._4_4_ = 0;
  EVar7.first = (uint)this_local;
  EVar7.second = result._0_8_;
  return EVar7;
}

Assistant:

EStatusCodeAndObjectIDType PDFCommentWriter::WriteCommentsTree(PDFComment* inComment,PDFCommentToObjectIDTypeMap& inCommentsContext)
{
	EStatusCodeAndObjectIDType result;
	ObjectIDType repliedTo = 0;

	// if already written, return
	PDFCommentToObjectIDTypeMap::iterator it = inCommentsContext.find(inComment);
	if(it != inCommentsContext.end())
	{
		result.first = eSuccess;
		result.second = it->second;
		return result;
	}

	// if has a referred comment, write it first
	if(inComment->ReplyTo != NULL)
	{
		EStatusCodeAndObjectIDType repliedtoResult = WriteCommentsTree(inComment->ReplyTo,inCommentsContext);

		if(repliedtoResult.first != eSuccess)
		{
			result.first = eFailure;
			result.second = 0;
			return result;
		}
		else
			repliedTo = repliedtoResult.second;
	}

	do
	{
		ObjectsContext& objectsContext = mPDFWriter->GetObjectsContext();

		// Start new InDirect object for annotation dictionary
		result.second = objectsContext.StartNewIndirectObject();
		if(result.second == 0)
		{
			result.first = eFailure;
			TRACE_LOG("PDFCommentWriter::WriteCommentsTree, Exception in starting comment dictionary");
			break;
		}
		
		DictionaryContext* dictionaryContext = objectsContext.StartDictionary();


		// Type
		dictionaryContext->WriteKey("Type");
		dictionaryContext->WriteNameValue("Annot");

		// SubType
		dictionaryContext->WriteKey("Subtype");
		dictionaryContext->WriteNameValue("Text");

		// Rect
		dictionaryContext->WriteKey("Rect");
		dictionaryContext->WriteRectangleValue(
			PDFRectangle(inComment->FrameBoundings[0],
						 inComment->FrameBoundings[1],
						 inComment->FrameBoundings[2],
						 inComment->FrameBoundings[3]));

		// Contents 
		dictionaryContext->WriteKey("Contents");
		dictionaryContext->WriteLiteralStringValue(PDFTextString(inComment->Text).ToString());

		// C (color)
		dictionaryContext->WriteKey("C");
		objectsContext.StartArray();
		if(inComment->Color.UseCMYK)
		{
			objectsContext.WriteDouble((double)inComment->Color.CMYKComponents[0]/255);
			objectsContext.WriteDouble((double)inComment->Color.CMYKComponents[1]/255);
			objectsContext.WriteDouble((double)inComment->Color.CMYKComponents[2]/255);
			objectsContext.WriteDouble((double)inComment->Color.CMYKComponents[3]/255);
		}
		else
		{
			objectsContext.WriteDouble((double)inComment->Color.RGBComponents[0]/255);
			objectsContext.WriteDouble((double)inComment->Color.RGBComponents[1]/255);
			objectsContext.WriteDouble((double)inComment->Color.RGBComponents[2]/255);
		}
		objectsContext.EndArray(eTokenSeparatorEndLine);

		// T
		dictionaryContext->WriteKey("T");
		dictionaryContext->WriteLiteralStringValue(PDFTextString(inComment->CommentatorName).ToString());
		
		// M
		dictionaryContext->WriteKey("M");
		dictionaryContext->WriteLiteralStringValue(inComment->Time.ToString());

		if(inComment->ReplyTo != NULL)
		{
			// IRT
			dictionaryContext->WriteKey("IRT");
			dictionaryContext->WriteObjectReferenceValue(repliedTo);

			// RT (we're doing always "reply" at this point, being a reply to comment
			dictionaryContext->WriteKey("RT");
			dictionaryContext->WriteNameValue("R");
		}

		// Open (we'll have them all closed to begin with)
		dictionaryContext->WriteKey("Open");
		dictionaryContext->WriteBooleanValue(false);

		// Name
		dictionaryContext->WriteKey("Name");
		dictionaryContext->WriteNameValue("Comment");

		if(objectsContext.EndDictionary(dictionaryContext) != eSuccess)
		{
			result.first = eFailure;
			TRACE_LOG("PDFCommentWriter::WriteCommentsTree, Exception in ending comment dictionary");
			break;
		}
		objectsContext.EndIndirectObject();
	
		inCommentsContext.insert(PDFCommentToObjectIDTypeMap::value_type(inComment,result.second));

		result.first = eSuccess;
	}while(false);
	
	return result;
}